

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSphericalHarmonic.cpp
# Opt level: O0

RealType __thiscall
OpenMD::RealSphericalHarmonic::getValueAt
          (RealSphericalHarmonic *this,RealType costheta,RealType phi)

{
  RealType in_RDI;
  RealType RVar1;
  double in_XMM1_Qa;
  int unaff_retaddr;
  int unaff_retaddr_00;
  RealSphericalHarmonic *in_stack_00000008;
  RealType phase;
  RealType p;
  undefined8 local_28;
  
  RVar1 = LegendreP(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_RDI);
  if (*(short *)((long)in_RDI + 0x10) == 0) {
    local_28 = sin((double)*(int *)((long)in_RDI + 0xc) * in_XMM1_Qa);
  }
  else {
    local_28 = cos((double)*(int *)((long)in_RDI + 0xc) * in_XMM1_Qa);
  }
  return *(double *)((long)in_RDI + 0x18) * RVar1 * local_28;
}

Assistant:

RealType RealSphericalHarmonic::getValueAt(RealType costheta, RealType phi) {
  RealType p, phase;

  // associated Legendre polynomial
  p = LegendreP(L, M, costheta);

  if (functionType == RSH_SIN) {
    phase = sin((RealType)M * phi);
  } else {
    phase = cos((RealType)M * phi);
  }

  return coefficient * p * phase;
}